

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::ActionFlag::ActionFlag
          (ActionFlag *this,Group *group_,string *name_,string *help_,Matcher *matcher_,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *action_,Options options_)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_68;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_38;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *action__local;
  Matcher *matcher__local;
  string *help__local;
  string *name__local;
  Group *group__local;
  ActionFlag *this_local;
  
  local_38 = action_;
  action__local =
       (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *)matcher_;
  matcher__local = (Matcher *)help_;
  help__local = name_;
  name__local = (string *)group_;
  group__local = (Group *)this;
  FlagBase::FlagBase(&this->super_FlagBase,name_,help_,matcher_,options_);
  (this->super_FlagBase).super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__ActionFlag_00368c38;
  std::
  function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(&this->action);
  Nargs::Nargs(&this->nargs,1);
  Group::Add((Group *)name__local,(Base *)this);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_68,action_);
  std::function<void(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
  ::operator=((function<void(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
               *)&this->action,(anon_class_32_1_3e1a7bc9 *)&local_68);
  ActionFlag(args::Group&,std::__cxx11::string_const&,std::__cxx11::string_const&,args::Matcher&&,std::function<void(std::__cxx11::string_const&)>,args::Options)
  ::{lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)#1}::
  ~vector((_lambda_std__vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const___1_
           *)&local_68);
  return;
}

Assistant:

ActionFlag(Group &group_, const std::string &name_, const std::string &help_, Matcher &&matcher_, std::function<void(const std::string &)> action_, Options options_ = {}):
                FlagBase(name_, help_, std::move(matcher_), options_), nargs(1)
            {
                group_.Add(*this);
                action = [action_](const std::vector<std::string> &a) { return action_(a.at(0)); };
            }